

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

bool __thiscall MlmWrap::blockforreply(MlmWrap *this,string *tracker,uint32_t timeoutms)

{
  mutex *__mutex;
  int iVar1;
  int iVar2;
  zmsg_t *self;
  char *__s1;
  ostream *poVar3;
  undefined8 uVar4;
  pointer unaff_R12;
  string local_68;
  string local_48;
  
  __mutex = &this->actormutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    zsock_send(this->actor,"ss4","BUR",(tracker->_M_dataplus)._M_p,(ulong)timeoutms);
    self = zactor_recv(this->actor);
    __s1 = zmsg_popstr(self);
    iVar1 = strcmp(__s1,"BURs");
    if (iVar1 != 0) {
      iVar2 = strcmp(__s1,"BURf");
      if (iVar2 != 0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Error with blockforreply() when waiting for ","");
        error(&local_48,this,&local_68);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_48._M_dataplus._M_p,
                            local_48._M_string_length);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(tracker->_M_dataplus)._M_p,tracker->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar1 == 0;
  }
  uVar4 = std::__throw_system_error(iVar1);
  if (local_68._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

bool MlmWrap::blockforreply(std::string tracker, uint32_t timeoutms){
    std::lock_guard<std::mutex> lock(actormutex);
    zsock_send(actor, "ss4", blockuntilrep, tracker.c_str(), timeoutms);
    zmsg_t *msg = zactor_recv(actor);
    char *status = zmsg_popstr(msg);
    bool success = false;
    if(streq(status, blockrepsuccess)){
        success = true;
    }
    else if(streq(status, blockrepfailure)){
        success = false;
    }
    else{
        std::cerr << error("Error with blockforreply() when waiting for ") << tracker << "\n";
    }
    return success;
}